

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

FProduction * ParseExpression(FCommandLine *argv,int *parsept)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double val;
  ulong local_48;
  size_t i;
  FProduction *prod3;
  FProduction *prod2;
  FProduction *prod1;
  char *token;
  int *parsept_local;
  FCommandLine *argv_local;
  
  iVar3 = *parsept;
  token = (char *)parsept;
  parsept_local = (int *)argv;
  iVar2 = FCommandLine::argc(argv);
  if (iVar3 < iVar2) {
    iVar3 = *(int *)token;
    *(int *)token = iVar3 + 1;
    prod1 = (FProduction *)FCommandLine::operator[]((FCommandLine *)parsept_local,iVar3);
    prod2 = (FProduction *)0x0;
    prod3 = (FProduction *)0x0;
    i = 0;
    bVar1 = IsFloat((char *)prod1);
    if (bVar1) {
      val = atof((char *)prod1);
      argv_local = (FCommandLine *)NewDoubleProd(val);
    }
    else {
      iVar3 = strcasecmp((char *)prod1,"true");
      if (iVar3 == 0) {
        argv_local = (FCommandLine *)NewDoubleProd(1.0);
      }
      else {
        iVar3 = strcasecmp((char *)prod1,"false");
        if (iVar3 == 0) {
          argv_local = (FCommandLine *)NewDoubleProd(0.0);
        }
        else {
          for (local_48 = 0; local_48 < 0x13; local_48 = local_48 + 1) {
            iVar3 = strcmp(Producers[local_48].Token,(char *)prod1);
            if (iVar3 == 0) {
              prod2 = ParseExpression((FCommandLine *)parsept_local,(int *)token);
              prod3 = ParseExpression((FCommandLine *)parsept_local,(int *)token);
              if ((prod2 == (FProduction *)0x0) || (prod3 == (FProduction *)0x0)) goto LAB_0044fb64;
              if (Producers[local_48].StringProducer ==
                  (_func_FProduction_ptr_FStringProd_ptr_FStringProd_ptr *)0x0) {
                DoubleCoerce(&prod2,&prod3);
              }
              else if (Producers[local_48].DoubleProducer ==
                       (_func_FProduction_ptr_FDoubleProd_ptr_FDoubleProd_ptr *)0x0) {
                MustStringCoerce(&prod2,&prod3);
              }
              else {
                MaybeStringCoerce(&prod2,&prod3);
              }
              if (prod2->Type == PROD_String) {
                i = (size_t)(*Producers[local_48].StringProducer)
                                      ((FStringProd *)prod2,(FStringProd *)prod3);
              }
              else {
                i = (size_t)(*Producers[local_48].DoubleProducer)
                                      ((FDoubleProd *)prod2,(FDoubleProd *)prod3);
              }
              goto LAB_0044fb76;
            }
          }
          iVar3 = strcmp("!",(char *)prod1);
          if (iVar3 == 0) {
            prod2 = ParseExpression((FCommandLine *)parsept_local,(int *)token);
            if (prod2 == (FProduction *)0x0) {
LAB_0044fb64:
              Printf("Missing argument to %s\n",prod1);
            }
            else {
              if (prod2->Type == PROD_String) {
                prod2 = &StringToDouble(prod2)->super_FProduction;
              }
              i = (size_t)NewDoubleProd((double)(-(ulong)(*(double *)(prod2 + 2) == 0.0) &
                                                0x3ff0000000000000));
            }
LAB_0044fb76:
            if (prod3 != (FProduction *)0x0) {
              M_Free(prod3);
            }
            if (prod2 != (FProduction *)0x0) {
              M_Free(prod2);
            }
            argv_local = (FCommandLine *)i;
          }
          else {
            argv_local = (FCommandLine *)NewStringProd((char *)prod1);
          }
        }
      }
    }
  }
  else {
    argv_local = (FCommandLine *)0x0;
  }
  return (FProduction *)argv_local;
}

Assistant:

static FProduction *ParseExpression (FCommandLine &argv, int &parsept)
{
	if (parsept >= argv.argc())
		return NULL;

	const char *token = argv[parsept++];
	FProduction *prod1 = NULL, *prod2 = NULL, *prod3 = NULL;

	if (IsFloat (token))
	{
		return NewDoubleProd (atof(token));
	}
	else if (stricmp (token, "true") == 0)
	{
		return NewDoubleProd (1.0);
	}
	else if (stricmp (token, "false") == 0)
	{
		return NewDoubleProd (0.0);
	}
	else
	{
		for (size_t i = 0; i < countof(Producers); ++i)
		{
			if (strcmp (Producers[i].Token, token) == 0)
			{
				prod1 = ParseExpression (argv, parsept);
				prod2 = ParseExpression (argv, parsept);
				if (prod1 == NULL || prod2 == NULL)
				{
					goto missing;
				}
				if (Producers[i].StringProducer == NULL)
				{
					DoubleCoerce (prod1, prod2);
				}
				else if (Producers[i].DoubleProducer == NULL)
				{
					MustStringCoerce (prod1, prod2);
				}
				else
				{
					MaybeStringCoerce (prod1, prod2);
				}
				if (prod1->Type == PROD_String)
				{
					prod3 = Producers[i].StringProducer ((FStringProd *)prod1, (FStringProd *)prod2);
				}
				else
				{
					prod3 = Producers[i].DoubleProducer ((FDoubleProd *)prod1, (FDoubleProd *)prod2);
				}
				goto done;
			}
		}
		if (strcmp ("!", token) == 0)
		{
			prod1 = ParseExpression (argv, parsept);
			if (prod1 == NULL)
			{
				goto missing;
			}
			if (prod1->Type == PROD_String)
			{
				prod1 = StringToDouble (prod1);
			}
			prod3 = NewDoubleProd (!static_cast<FDoubleProd *>(prod1)->Value);
			goto done;
		}
		return NewStringProd (token);
	}

missing:
	Printf ("Missing argument to %s\n", token);

done:
	if (prod2 != NULL) M_Free (prod2);
	if (prod1 != NULL) M_Free (prod1);
	return prod3;
}